

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int addSystemPropertyToMessageWithDecodeIfNeeded
              (IOTHUB_MESSAGE_HANDLE iotHubMessage,IOTHUB_SYSTEM_PROPERTY_TYPE propertyType,
              char *propertyValue,_Bool auto_url_encode_decode)

{
  int iVar1;
  STRING_HANDLE handle;
  LOGGER_LOG p_Var2;
  char *propValue;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  STRING_HANDLE propValue_decoded;
  int result;
  _Bool auto_url_encode_decode_local;
  char *propertyValue_local;
  IOTHUB_SYSTEM_PROPERTY_TYPE propertyType_local;
  IOTHUB_MESSAGE_HANDLE iotHubMessage_local;
  
  propValue_decoded._0_4_ = 0;
  if (auto_url_encode_decode) {
    handle = URL_DecodeString(propertyValue);
    if (handle == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6a9,1,
                  "Failed to URL decode property value");
      }
      propValue_decoded._0_4_ = 0x6aa;
    }
    else {
      propValue = STRING_c_str(handle);
      iVar1 = addSystemPropertyToMessage(iotHubMessage,propertyType,propValue);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6ae,1,
                    "Unable to set message property");
        }
        propValue_decoded._0_4_ = 0x6af;
      }
    }
    STRING_delete(handle);
  }
  else {
    iVar1 = addSystemPropertyToMessage(iotHubMessage,propertyType,propertyValue);
    if (iVar1 == 0) {
      propValue_decoded._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6b7,1,
                  "Unable to set message property");
      }
      propValue_decoded._0_4_ = 0x6b8;
    }
  }
  return (int)propValue_decoded;
}

Assistant:

static int addSystemPropertyToMessageWithDecodeIfNeeded(IOTHUB_MESSAGE_HANDLE iotHubMessage, IOTHUB_SYSTEM_PROPERTY_TYPE propertyType, const char* propertyValue, bool auto_url_encode_decode)
{
    int result = 0;

    if (auto_url_encode_decode)
    {
        STRING_HANDLE propValue_decoded;
        if ((propValue_decoded = URL_DecodeString(propertyValue)) == NULL)
        {
            LogError("Failed to URL decode property value");
            result = MU_FAILURE;
        }
        else if (addSystemPropertyToMessage(iotHubMessage, propertyType, STRING_c_str(propValue_decoded)) != 0)
        {
            LogError("Unable to set message property");
            result = MU_FAILURE;
        }
        STRING_delete(propValue_decoded);
    }
    else
    {
        if (addSystemPropertyToMessage(iotHubMessage, propertyType, propertyValue) != 0)
        {
            LogError("Unable to set message property");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}